

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_aarch64.c
# Opt level: O3

uc_err reg_write_aarch64(void *_env,int mode,uint regid,void *value,size_t *size,int *setpc)

{
  uc_err uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = regid - 0x7c;
  if (0x1f < regid - 0xe4) {
    uVar3 = regid;
  }
  if (uVar3 - 199 < 0x1d) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 199) * 8 + 0x40) = *value;
  }
  else if (uVar3 - 0xa8 < 0x1f) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(undefined4 *)((long)_env + (ulong)(uVar3 - 0xa8) * 8 + 0x40) = *value;
  }
  else if (uVar3 - 0x68 < 0x20) {
    if (*size < 0x10) {
      return UC_ERR_OVERFLOW;
    }
    *size = 0x10;
    lVar2 = (ulong)(uVar3 - 0x68) * 0x100;
    *(undefined8 *)((long)_env + lVar2 + 0xc10) = *value;
    *(undefined8 *)((long)_env + lVar2 + 0xc18) = *(undefined8 *)((long)value + 8);
  }
  else if (uVar3 - 0x28 < 0x20) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 0x28) * 0x100 + 0xc10) = *value;
  }
  else if (uVar3 - 0x88 < 0x20) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    *(undefined4 *)((long)_env + (ulong)(uVar3 - 0x88) * 0x100 + 0xc10) = *value;
  }
  else if (uVar3 - 0x48 < 0x20) {
    if (*size < 2) {
      return UC_ERR_OVERFLOW;
    }
    *size = 2;
    *(undefined2 *)((long)_env + (ulong)(uVar3 - 0x48) * 0x100 + 0xc10) = *value;
  }
  else if (uVar3 - 8 < 0x20) {
    if (*size == 0) {
      return UC_ERR_OVERFLOW;
    }
    *size = 1;
    *(undefined1 *)((long)_env + (ulong)(uVar3 - 8) * 0x100 + 0xc10) = *value;
  }
  else if (uVar3 - 0x10a < 4) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 0x10a) * 8 + 0x238) = *value;
  }
  else if (uVar3 - 0x10e < 4) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 0x10e) * 8 + 600) = *value;
  }
  else if ((uVar3 & 0xfffffffc) == 0x118) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 0x118) * 8 + 0x418) = *value;
  }
  else if ((uVar3 & 0xfffffffc) == 0x114) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 0x114) * 8 + 0x3d8) = *value;
  }
  else if (uVar3 - 0x11e < 4) {
    if (*size < 8) {
      return UC_ERR_OVERFLOW;
    }
    *size = 8;
    *(undefined8 *)((long)_env + (ulong)(uVar3 - 0x11e) * 8 + 0x4c0) = *value;
  }
  else {
    uVar1 = UC_ERR_ARG;
    switch(uVar3) {
    case 0x104:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x140) = *value;
      *setpc = 1;
      break;
    case 0x105:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      *(ulong *)((long)_env + 0x2c0) = (ulong)*value;
      break;
    case 0x106:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x510) = *value;
      break;
    case 0x107:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x548) = *value;
      break;
    case 0x108:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x518) = *value;
      break;
    case 0x109:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      pstate_write((CPUARMState_conflict *)_env,*value);
      break;
    case 0x10a:
    case 0x10b:
    case 0x10c:
    case 0x10d:
    case 0x10e:
    case 0x10f:
    case 0x110:
    case 0x111:
      goto switchD_00493293_caseD_11e;
    case 0x112:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x308) = *value;
      break;
    case 0x113:
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      *(undefined8 *)((long)_env + 0x328) = *value;
      break;
    default:
      switch(uVar3) {
      case 0x11c:
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        *(undefined8 *)((long)_env + 0x450) = *value;
        break;
      case 0x11d:
        if (*size < 8) {
          return UC_ERR_OVERFLOW;
        }
        *size = 8;
        *(undefined8 *)((long)_env + 0x4a8) = *value;
        break;
      case 0x11e:
      case 0x11f:
      case 0x120:
      case 0x121:
        goto switchD_00493293_caseD_11e;
      case 0x122:
        if (*size < 0x20) {
          return UC_ERR_OVERFLOW;
        }
        *size = 0x20;
        uVar1 = write_cp_reg((CPUARMState_conflict *)_env,(uc_arm64_cp_reg *)value);
        arm_rebuild_hflags_aarch64((CPUARMState_conflict *)_env);
        return uVar1;
      case 0x123:
        if (*size < 4) {
          return UC_ERR_OVERFLOW;
        }
        *size = 4;
        vfp_set_fpcr((CPUARMState_conflict *)_env,*value);
        break;
      case 0x124:
        if (*size < 4) {
          return UC_ERR_OVERFLOW;
        }
        *size = 4;
        vfp_set_fpsr((CPUARMState_conflict *)_env,*value);
        break;
      default:
        switch(uVar3) {
        case 1:
          if (*size < 8) {
            return UC_ERR_OVERFLOW;
          }
          *size = 8;
          *(undefined8 *)((long)_env + 0x128) = *value;
          break;
        case 2:
          if (*size < 8) {
            return UC_ERR_OVERFLOW;
          }
          *size = 8;
          *(undefined8 *)((long)_env + 0x130) = *value;
          break;
        case 3:
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          cpsr_write_aarch64((CPUARMState_conflict *)_env,*value,0xf0000000,CPSRWriteRaw);
          break;
        case 4:
          if (*size < 8) {
            return UC_ERR_OVERFLOW;
          }
          *size = 8;
          *(undefined8 *)((long)_env + 0x138) = *value;
          break;
        default:
          goto switchD_00493293_caseD_11e;
        }
      }
    }
  }
  uVar1 = UC_ERR_OK;
switchD_00493293_caseD_11e:
  return uVar1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_write(void *_env, int mode, unsigned int regid, const void *value,
                 size_t *size, int *setpc)
{
    CPUARMState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_ARM64_REG_V0 && regid <= UC_ARM64_REG_V31) {
        regid += UC_ARM64_REG_Q0 - UC_ARM64_REG_V0;
    }
    if (regid >= UC_ARM64_REG_X0 && regid <= UC_ARM64_REG_X28) {
        CHECK_REG_TYPE(uint64_t);
        env->xregs[regid - UC_ARM64_REG_X0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_W0 && regid <= UC_ARM64_REG_W30) {
        CHECK_REG_TYPE(uint32_t);
        WRITE_DWORD(env->xregs[regid - UC_ARM64_REG_W0], *(uint32_t *)value);
    } else if (regid >= UC_ARM64_REG_Q0 && regid <= UC_ARM64_REG_Q31) {
        CHECK_REG_TYPE(float64[2]);
        float64 *src = (float64 *)value;
        uint32_t reg_index = regid - UC_ARM64_REG_Q0;
        env->vfp.zregs[reg_index].d[0] = src[0];
        env->vfp.zregs[reg_index].d[1] = src[1];
    } else if (regid >= UC_ARM64_REG_D0 && regid <= UC_ARM64_REG_D31) {
        CHECK_REG_TYPE(float64);
        env->vfp.zregs[regid - UC_ARM64_REG_D0].d[0] = *(float64 *)value;
    } else if (regid >= UC_ARM64_REG_S0 && regid <= UC_ARM64_REG_S31) {
        CHECK_REG_TYPE(int32_t);
        WRITE_DWORD(env->vfp.zregs[regid - UC_ARM64_REG_S0].d[0],
                    *(int32_t *)value);
    } else if (regid >= UC_ARM64_REG_H0 && regid <= UC_ARM64_REG_H31) {
        CHECK_REG_TYPE(int16_t);
        WRITE_WORD(env->vfp.zregs[regid - UC_ARM64_REG_H0].d[0],
                   *(int16_t *)value);
    } else if (regid >= UC_ARM64_REG_B0 && regid <= UC_ARM64_REG_B31) {
        CHECK_REG_TYPE(int8_t);
        WRITE_BYTE_L(env->vfp.zregs[regid - UC_ARM64_REG_B0].d[0],
                     *(int8_t *)value);
    } else if (regid >= UC_ARM64_REG_ELR_EL0 && regid <= UC_ARM64_REG_ELR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->elr_el[regid - UC_ARM64_REG_ELR_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_SP_EL0 && regid <= UC_ARM64_REG_SP_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->sp_el[regid - UC_ARM64_REG_SP_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_ESR_EL0 && regid <= UC_ARM64_REG_ESR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->cp15.esr_el[regid - UC_ARM64_REG_ESR_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_FAR_EL0 && regid <= UC_ARM64_REG_FAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->cp15.far_el[regid - UC_ARM64_REG_FAR_EL0] = *(uint64_t *)value;
    } else if (regid >= UC_ARM64_REG_VBAR_EL0 &&
               regid <= UC_ARM64_REG_VBAR_EL3) {
        CHECK_REG_TYPE(uint64_t);
        env->cp15.vbar_el[regid - UC_ARM64_REG_VBAR_EL0] = *(uint64_t *)value;
    } else {
        switch (regid) {
        default:
            break;
        case UC_ARM64_REG_CPACR_EL1:
            CHECK_REG_TYPE(uint32_t);
            env->cp15.cpacr_el1 = *(uint32_t *)value;
            break;
        case UC_ARM64_REG_TPIDR_EL0:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.tpidr_el[0] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_TPIDRRO_EL0:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.tpidrro_el[0] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_TPIDR_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.tpidr_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_X29:
            CHECK_REG_TYPE(uint64_t);
            env->xregs[29] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_X30:
            CHECK_REG_TYPE(uint64_t);
            env->xregs[30] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_PC:
            CHECK_REG_TYPE(uint64_t);
            env->pc = *(uint64_t *)value;
            *setpc = 1;
            break;
        case UC_ARM64_REG_SP:
            CHECK_REG_TYPE(uint64_t);
            env->xregs[31] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_NZCV:
            CHECK_REG_TYPE(uint32_t);
            cpsr_write(env, *(uint32_t *)value, CPSR_NZCV, CPSRWriteRaw);
            break;
        case UC_ARM64_REG_PSTATE:
            CHECK_REG_TYPE(uint32_t);
            pstate_write(env, *(uint32_t *)value);
            break;
        case UC_ARM64_REG_TTBR0_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.ttbr0_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_TTBR1_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.ttbr1_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_PAR_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.par_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_MAIR_EL1:
            CHECK_REG_TYPE(uint64_t);
            env->cp15.mair_el[1] = *(uint64_t *)value;
            break;
        case UC_ARM64_REG_CP_REG:
            CHECK_REG_TYPE(uc_arm64_cp_reg);
            ret = write_cp_reg(env, (uc_arm64_cp_reg *)value);
            arm_rebuild_hflags(env);
            break;
        case UC_ARM64_REG_FPCR:
            CHECK_REG_TYPE(uint32_t);
            vfp_set_fpcr(env, *(uint32_t *)value);
            break;
        case UC_ARM64_REG_FPSR:
            CHECK_REG_TYPE(uint32_t);
            vfp_set_fpsr(env, *(uint32_t *)value);
            break;
        }
    }

    return ret;
}